

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

FunctionPortListSyntax * __thiscall
slang::parsing::Parser::parseFunctionPortList
          (Parser *this,bitmask<slang::parsing::detail::FunctionOptions> options)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token closeParen_00;
  Token openParen_00;
  bool bVar1;
  EVP_PKEY_CTX *src;
  Info *extraout_RDX;
  undefined8 *in_RDI;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token closeParen;
  Token openParen;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe0c;
  Token *in_stack_fffffffffffffe10;
  SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> *this_00;
  undefined4 uVar3;
  undefined2 in_stack_fffffffffffffe1c;
  TokenKind in_stack_fffffffffffffe1e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe20;
  undefined8 *puVar4;
  ParserBase *in_stack_fffffffffffffe30;
  Info *pIVar5;
  undefined1 local_128 [76];
  RequireItems in_stack_ffffffffffffff24;
  Token *in_stack_ffffffffffffff28;
  TokenKind in_stack_ffffffffffffff34;
  TokenKind in_stack_ffffffffffffff36;
  SmallVectorBase<slang::syntax::TokenOrSyntax> *in_stack_ffffffffffffff38;
  ParserBase *in_stack_ffffffffffffff40;
  DiagCode in_stack_ffffffffffffff50;
  anon_class_16_2_83b1a94b *in_stack_ffffffffffffff58;
  AllowEmpty in_stack_ffffffffffffff60;
  FunctionPortListSyntax *local_8;
  
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe20._M_extent_value,
                           in_stack_fffffffffffffe1e);
  if (bVar1) {
    ParserBase::consume(in_stack_fffffffffffffe30);
    Token::Token(in_stack_fffffffffffffe10);
    SmallVector<slang::syntax::TokenOrSyntax,_8UL>::SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x6cab80);
    local_128._20_4_ = 0x3d0005;
    this_00 = (SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> *)local_128;
    uVar2 = 0x3d0005;
    uVar3 = 0;
    ParserBase::
    parseList<&slang::syntax::SyntaxFacts::isPossibleFunctionPort,&slang::syntax::SyntaxFacts::isEndOfParenList,slang::parsing::Parser::parseFunctionPortList(slang::bitmask<slang::parsing::detail::FunctionOptions>)::__0>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff36,
               in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
    puVar4 = in_RDI + 0x1c;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
              ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)(local_128 + 0x18),
               (EVP_PKEY_CTX *)*in_RDI,src);
    elements._M_ptr._4_2_ = in_stack_fffffffffffffe1c;
    elements._M_ptr._0_4_ = uVar3;
    elements._M_ptr._6_2_ = in_stack_fffffffffffffe1e;
    elements._M_extent._M_extent_value = in_stack_fffffffffffffe20._M_extent_value;
    pIVar5 = extraout_RDX;
    slang::syntax::SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax>::SeparatedSyntaxList
              (this_00,elements);
    openParen_00.info = pIVar5;
    openParen_00._0_8_ = puVar4;
    closeParen_00.rawLen._0_2_ = in_stack_fffffffffffffe1c;
    closeParen_00.kind = (short)uVar3;
    closeParen_00._2_1_ = (char)((uint)uVar3 >> 0x10);
    closeParen_00.numFlags.raw = (char)((uint)uVar3 >> 0x18);
    closeParen_00.rawLen._2_2_ = in_stack_fffffffffffffe1e;
    closeParen_00.info = (Info *)in_stack_fffffffffffffe20._M_extent_value;
    local_8 = slang::syntax::SyntaxFactory::functionPortList
                        ((SyntaxFactory *)this_00,openParen_00,
                         (SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> *)
                         CONCAT44(in_stack_fffffffffffffe0c,uVar2),closeParen_00);
    SmallVector<slang::syntax::TokenOrSyntax,_8UL>::~SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x6caca4);
  }
  else {
    local_8 = (FunctionPortListSyntax *)0x0;
  }
  return local_8;
}

Assistant:

FunctionPortListSyntax* Parser::parseFunctionPortList(bitmask<FunctionOptions> options) {
    if (!peek(TokenKind::OpenParenthesis))
        return nullptr;

    auto openParen = consume();
    Token closeParen;
    SmallVector<TokenOrSyntax, 8> buffer;
    parseList<isPossibleFunctionPort, isEndOfParenList>(
        buffer, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen, RequireItems::False,
        diag::ExpectedFunctionPort, [this, options] { return &parseFunctionPort(options); });

    return &factory.functionPortList(openParen, buffer.copy(alloc), closeParen);
}